

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# truncated_normal_dist.hpp
# Opt level: O0

basic_istream<char,_std::char_traits<char>_> *
trng::operator>>(basic_istream<char,_std::char_traits<char>_> *in,param_type *P)

{
  undefined1 b_00 [16];
  undefined1 a_00 [16];
  undefined1 sigma_00 [16];
  undefined1 mu_00 [16];
  bool bVar1;
  _Ios_Fmtflags _Var2;
  ios_base *this;
  basic_istream<char,_std::char_traits<char>_> *pbVar3;
  void *in_RSI;
  basic_istream<char,_std::char_traits<char>_> *in_RDI;
  fmtflags flags;
  longdouble b;
  longdouble a;
  longdouble sigma;
  longdouble mu;
  delim_c *in_stack_fffffffffffffec8;
  undefined2 in_stack_fffffffffffffed0;
  undefined6 in_stack_fffffffffffffed2;
  undefined6 in_stack_fffffffffffffee2;
  undefined6 in_stack_fffffffffffffef2;
  undefined6 in_stack_ffffffffffffff02;
  undefined1 local_c8 [103];
  char local_61;
  char local_60;
  char local_5f;
  char local_5e;
  char local_5d;
  fmtflags local_5c;
  longdouble local_58;
  longdouble local_48;
  longdouble local_38;
  longdouble local_28;
  void *local_10;
  basic_istream<char,_std::char_traits<char>_> *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_5c = Catch::clara::std::ios_base::flags
                       ((ios_base *)(in_RDI + *(long *)(*(long *)in_RDI + -0x18)));
  this = (ios_base *)(local_8 + *(long *)(*(long *)local_8 + -0x18));
  _Var2 = Catch::clara::std::operator|(_S_dec,_S_fixed);
  _Var2 = Catch::clara::std::operator|(_Var2,_S_left);
  Catch::clara::std::ios_base::flags(this,_Var2);
  local_5d = (char)utility::delim('\0');
  pbVar3 = utility::operator>>((basic_istream<char,_std::char_traits<char>_> *)
                               CONCAT62(in_stack_fffffffffffffed2,in_stack_fffffffffffffed0),
                               in_stack_fffffffffffffec8);
  std::istream::operator>>((istream *)pbVar3,&local_28);
  local_5e = (char)utility::delim('\0');
  pbVar3 = utility::operator>>((basic_istream<char,_std::char_traits<char>_> *)
                               CONCAT62(in_stack_fffffffffffffed2,in_stack_fffffffffffffed0),
                               in_stack_fffffffffffffec8);
  std::istream::operator>>((istream *)pbVar3,&local_38);
  local_5f = (char)utility::delim('\0');
  pbVar3 = utility::operator>>((basic_istream<char,_std::char_traits<char>_> *)
                               CONCAT62(in_stack_fffffffffffffed2,in_stack_fffffffffffffed0),
                               in_stack_fffffffffffffec8);
  std::istream::operator>>((istream *)pbVar3,&local_48);
  local_60 = (char)utility::delim('\0');
  pbVar3 = utility::operator>>((basic_istream<char,_std::char_traits<char>_> *)
                               CONCAT62(in_stack_fffffffffffffed2,in_stack_fffffffffffffed0),
                               in_stack_fffffffffffffec8);
  std::istream::operator>>((istream *)pbVar3,&local_58);
  local_61 = (char)utility::delim('\0');
  utility::operator>>((basic_istream<char,_std::char_traits<char>_> *)
                      CONCAT62(in_stack_fffffffffffffed2,in_stack_fffffffffffffed0),
                      in_stack_fffffffffffffec8);
  bVar1 = std::ios::operator_cast_to_bool((ios *)(local_8 + *(long *)(*(long *)local_8 + -0x18)));
  if (bVar1) {
    mu_00._2_6_ = in_stack_fffffffffffffef2;
    mu_00._0_2_ = (short)((unkuint10)local_48 >> 0x40);
    mu_00._8_8_ = SUB108(local_58,0);
    sigma_00._2_6_ = in_stack_fffffffffffffee2;
    sigma_00._0_2_ = (short)((unkuint10)local_38 >> 0x40);
    sigma_00._8_8_ = SUB108(local_48,0);
    a_00._2_6_ = in_stack_fffffffffffffed2;
    a_00._0_2_ = (short)((unkuint10)local_28 >> 0x40);
    a_00._8_8_ = SUB108(local_38,0);
    b_00._8_8_ = SUB108(local_28,0);
    b_00._0_8_ = 0x36991b;
    truncated_normal_dist<long_double>::param_type::param_type
              ((param_type *)
               CONCAT62(in_stack_ffffffffffffff02,(short)((unkuint10)local_58 >> 0x40)),
               (result_type_conflict3)mu_00,(result_type_conflict3)sigma_00,
               (result_type_conflict3)a_00,(result_type_conflict3)b_00);
    memcpy(local_10,local_c8,0x60);
  }
  Catch::clara::std::ios_base::flags
            ((ios_base *)(local_8 + *(long *)(*(long *)local_8 + -0x18)),local_5c);
  return local_8;
}

Assistant:

std::basic_istream<char_t, traits_t> &operator>>(
          std::basic_istream<char_t, traits_t> &in, param_type &P) {
        float_t mu, sigma, a, b;
        std::ios_base::fmtflags flags(in.flags());
        in.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
        in >> utility::delim('(') >> mu >> utility::delim(' ') >> sigma >>
            utility::delim(' ') >> a >> utility::delim(' ') >> b >> utility::delim(')');
        if (in)
          P = param_type(mu, sigma, a, b);
        in.flags(flags);
        return in;
      }